

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

void __thiscall CVmObjTable::clear_obj_table(CVmObjTable *this)

{
  long *plVar1;
  ushort uVar2;
  CVmObjPageEntry *pCVar3;
  long lVar4;
  ulong uVar5;
  
  CVmHashTable::delete_all_entries(this->post_load_init_table_);
  if (this->pages_used_ != 0) {
    uVar5 = 0;
    do {
      pCVar3 = this->pages_[uVar5];
      lVar4 = 0;
      do {
        uVar2 = *(ushort *)(&pCVar3->field_0x14 + lVar4);
        if ((uVar2 & 1) == 0) {
          plVar1 = (long *)((long)&pCVar3->ptr_ + lVar4);
          (**(code **)(*plVar1 + 0x10))(plVar1,uVar2 >> 1 & 1);
        }
        lVar4 = lVar4 + 0x18;
      } while ((int)lVar4 != 0x18000);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->pages_used_);
  }
  return;
}

Assistant:

void CVmObjTable::clear_obj_table(VMG0_)
{
    /* delete all entries in the post-load initialization table */
    post_load_init_table_->delete_all_entries();

    /* go through the pages and delete the entries */
    for (size_t i = 0 ; i < pages_used_ ; ++i)
    {
        /* delete all of the objects on the page */
        unsigned int j;
		CVmObjPageEntry *entry;
        for (j = 0, entry = pages_[i] ; j < VM_OBJ_PAGE_CNT ; ++j, ++entry)
        {
            /* if this entry is still in use, delete it */
            if (!entry->free_)
                entry->get_vm_obj()->notify_delete(vmg_ entry->in_root_set_);
        }
    }

}